

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O3

ECalType icu_63::getCalendarTypeForLocale(char *locid)

{
  int32_t iVar1;
  int iVar2;
  UResourceBundle *resB;
  UResourceBundle *resB_00;
  UChar *us;
  int i;
  ulong uVar3;
  uint uVar4;
  int i_1;
  long lVar5;
  char **ppcVar6;
  UErrorCode status;
  int32_t len;
  char region [4];
  char calTypeBuf [32];
  char canonicalName [256];
  UErrorCode local_164;
  int32_t local_160;
  char local_15c [4];
  char local_158 [32];
  char local_138 [264];
  
  local_164 = U_ZERO_ERROR;
  iVar1 = uloc_canonicalize_63(locid,local_138,0xff,&local_164);
  uVar3 = 0;
  if (local_164 < U_ILLEGAL_ARGUMENT_ERROR) {
    local_138[iVar1] = '\0';
    iVar1 = uloc_getKeywordValue_63(local_138,"calendar",local_158,0x1f,&local_164);
    if (local_164 < U_ILLEGAL_ARGUMENT_ERROR) {
      local_158[iVar1] = '\0';
      ppcVar6 = gCalTypes;
      uVar3 = 0;
      do {
        iVar2 = uprv_stricmp_63(local_158,*ppcVar6);
        if (iVar2 == 0) goto LAB_001e5f8d;
        uVar3 = uVar3 + 1;
        ppcVar6 = ppcVar6 + 1;
      } while (uVar3 != 0x12);
    }
    local_164 = U_ZERO_ERROR;
    ulocimp_getRegionForSupplementalData_63(local_138,'\x01',local_15c,4,&local_164);
    uVar3 = 0;
    if (local_164 < U_ILLEGAL_ARGUMENT_ERROR) {
      resB = ures_openDirect_63((char *)0x0,"supplementalData",&local_164);
      ures_getByKey_63(resB,"calendarPreferenceData",resB,&local_164);
      resB_00 = ures_getByKey_63(resB,local_15c,(UResourceBundle *)0x0,&local_164);
      if (resB != (UResourceBundle *)0x0 && local_164 == U_MISSING_RESOURCE_ERROR) {
        local_164 = U_ZERO_ERROR;
        resB_00 = ures_getByKey_63(resB,"001",(UResourceBundle *)0x0,&local_164);
      }
      local_158[0] = '\0';
      uVar4 = 0xffffffff;
      if (resB_00 != (UResourceBundle *)0x0 && local_164 < U_ILLEGAL_ARGUMENT_ERROR) {
        local_160 = 0;
        us = ures_getStringByIndex_63(resB_00,0,&local_160,&local_164);
        uVar4 = 0xffffffff;
        if (local_160 < 0x20) {
          u_UCharsToChars_63(us,local_158,local_160);
          local_158[local_160] = '\0';
          ppcVar6 = gCalTypes;
          lVar5 = 0;
          do {
            iVar2 = uprv_stricmp_63(local_158,*ppcVar6);
            if (iVar2 == 0) {
              uVar4 = (uint)lVar5;
              break;
            }
            lVar5 = lVar5 + 1;
            ppcVar6 = ppcVar6 + 1;
          } while (lVar5 != 0x12);
        }
      }
      ures_close_63(resB_00);
      ures_close_63(resB);
      uVar3 = 0;
      if (uVar4 != 0xffffffff) {
        uVar3 = (ulong)uVar4;
      }
    }
  }
LAB_001e5f8d:
  return (ECalType)uVar3;
}

Assistant:

static ECalType getCalendarTypeForLocale(const char *locid) {
    UErrorCode status = U_ZERO_ERROR;
    ECalType calType = CALTYPE_UNKNOWN;

    //TODO: ULOC_FULL_NAME is out of date and too small..
    char canonicalName[256];

    // canonicalize, so grandfathered variant will be transformed to keywords
    // e.g ja_JP_TRADITIONAL -> ja_JP@calendar=japanese
    int32_t canonicalLen = uloc_canonicalize(locid, canonicalName, sizeof(canonicalName) - 1, &status);
    if (U_FAILURE(status)) {
        return CALTYPE_GREGORIAN;
    }
    canonicalName[canonicalLen] = 0;    // terminate

    char calTypeBuf[32];
    int32_t calTypeBufLen;

    calTypeBufLen = uloc_getKeywordValue(canonicalName, "calendar", calTypeBuf, sizeof(calTypeBuf) - 1, &status);
    if (U_SUCCESS(status)) {
        calTypeBuf[calTypeBufLen] = 0;
        calType = getCalendarType(calTypeBuf);
        if (calType != CALTYPE_UNKNOWN) {
            return calType;
        }
    }
    status = U_ZERO_ERROR;

    // when calendar keyword is not available or not supported, read supplementalData
    // to get the default calendar type for the locale's region
    char region[ULOC_COUNTRY_CAPACITY];
    (void)ulocimp_getRegionForSupplementalData(canonicalName, TRUE, region, sizeof(region), &status);
    if (U_FAILURE(status)) {
        return CALTYPE_GREGORIAN;
    }

    // Read preferred calendar values from supplementalData calendarPreference
    UResourceBundle *rb = ures_openDirect(NULL, "supplementalData", &status);
    ures_getByKey(rb, "calendarPreferenceData", rb, &status);
    UResourceBundle *order = ures_getByKey(rb, region, NULL, &status);
    if (status == U_MISSING_RESOURCE_ERROR && rb != NULL) {
        status = U_ZERO_ERROR;
        order = ures_getByKey(rb, "001", NULL, &status);
    }

    calTypeBuf[0] = 0;
    if (U_SUCCESS(status) && order != NULL) {
        // the first calender type is the default for the region
        int32_t len = 0;
        const UChar *uCalType = ures_getStringByIndex(order, 0, &len, &status);
        if (len < (int32_t)sizeof(calTypeBuf)) {
            u_UCharsToChars(uCalType, calTypeBuf, len);
            *(calTypeBuf + len) = 0; // terminate;
            calType = getCalendarType(calTypeBuf);
        }
    }

    ures_close(order);
    ures_close(rb);

    if (calType == CALTYPE_UNKNOWN) {
        // final fallback
        calType = CALTYPE_GREGORIAN;
    }
    return calType;
}